

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int client_hello_decode_server_name(ptls_iovec_t *name,uint8_t **src,uint8_t *end)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t *puVar3;
  byte *pbVar4;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  byte *pbVar9;
  byte *pbVar10;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  byte *__s;
  ulong uVar14;
  ulong uVar15;
  
  iVar6 = 0x32;
  if (1 < (ulong)((long)end - (long)*src)) {
    pbVar10 = *src;
    lVar8 = -2;
    uVar11 = 0;
    pbVar9 = pbVar10;
    do {
      uVar15 = uVar11 * 0x100;
      pbVar12 = pbVar9 + 1;
      *src = pbVar12;
      bVar1 = *pbVar9;
      uVar11 = uVar15 + bVar1;
      pbVar10 = pbVar10 + 1;
      lVar8 = lVar8 + 1;
      pbVar9 = pbVar12;
    } while (lVar8 != 0);
    iVar6 = 0x32;
    if ((uVar11 <= (ulong)((long)end - (long)pbVar10)) && (uVar11 != 0)) {
      uVar15 = uVar15 | bVar1;
      iVar6 = 0;
      do {
        puVar3 = *src;
        *src = puVar3 + 1;
        if (pbVar10 + (uVar15 - (long)puVar3) + -1 < (byte *)0x2) {
LAB_0011a505:
          bVar5 = false;
          iVar6 = 0x32;
        }
        else {
          uVar2 = *puVar3;
          pbVar4 = *src;
          lVar8 = 0;
          pbVar9 = (byte *)0x0;
          pbVar13 = pbVar4;
          do {
            uVar14 = (long)pbVar9 * 0x100;
            __s = pbVar13 + 1;
            *src = __s;
            bVar1 = *pbVar13;
            pbVar9 = (byte *)(bVar1 + uVar14);
            lVar8 = lVar8 + 1;
            pbVar13 = __s;
          } while (lVar8 != 2);
          if (pbVar10 + (uVar15 - (long)pbVar4) + -2 < pbVar9) goto LAB_0011a505;
          if (uVar2 == '\0') {
            pvVar7 = memchr(__s,0,(size_t)pbVar9);
            if (pvVar7 == (void *)0x0) {
              name->base = __s;
              name->len = (size_t)pbVar9;
              goto LAB_0011a513;
            }
            iVar6 = 0x2f;
            bVar5 = false;
          }
          else {
LAB_0011a513:
            *src = __s + (uVar14 | bVar1);
            bVar5 = true;
          }
        }
      } while ((bVar5) && (pbVar12 + uVar11 != *src));
    }
  }
  return iVar6;
}

Assistant:

static int client_hello_decode_server_name(ptls_iovec_t *name, const uint8_t **src, const uint8_t *const end)
{
    int ret = 0;

    ptls_decode_open_block(*src, end, 2, {
        if (*src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        do {
            uint8_t type = *(*src)++;
            ptls_decode_open_block(*src, end, 2, {
                switch (type) {
                case PTLS_SERVER_NAME_TYPE_HOSTNAME:
                    if (memchr(*src, '\0', end - *src) != 0) {
                        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                        goto Exit;
                    }
                    *name = ptls_iovec_init(*src, end - *src);
                    break;
                default:
                    break;
                }
                *src = end;
            });
        } while (*src != end);
    });

Exit:
    return ret;
}